

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall
Annotator_getVariablePairFromId_Test::~Annotator_getVariablePairFromId_Test
          (Annotator_getVariablePairFromId_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, getVariablePairFromId)
{
    auto model = createModelTwoComponentsWithOneVariableEach("model", "c1", "c2", "v1", "v2");
    auto annotator = libcellml::Annotator::create();

    // Unit items.
    auto units = libcellml::Units::create("units");
    units->addUnit("metre", 1.0, "unit1_id");
    units->addUnit("second", 1.0, "unit2_id");
    units->addUnit("newton", 1.0, "unit3_id");
    model->addUnits(units);

    // Encapsulation structure.
    auto c1 = model->component("c1");
    auto c2 = model->component("c2");
    auto v1 = c1->variable("v1");
    auto v2 = c2->variable("v2");
    auto v3 = libcellml::Variable::create("v3");
    auto v4 = libcellml::Variable::create("v4");
    c1->addVariable(v3);
    c2->addVariable(v4);

    c1->addComponent(c2);
    model->setEncapsulationId("encapsulation_id");
    c1->setEncapsulationId("component_ref1_id");
    c2->setEncapsulationId("component_ref2_id");

    // Connections and mappings.
    c1->variable("v1")->setInterfaceType("public_and_private");
    c2->variable("v2")->setInterfaceType("public_and_private");
    c1->variable("v3")->setInterfaceType("public_and_private");
    c2->variable("v4")->setInterfaceType("public_and_private");
    libcellml::Variable::addEquivalence(c1->variable("v1"), c2->variable("v2"));
    libcellml::Variable::addEquivalence(c1->variable("v3"), c2->variable("v4"));
    libcellml::Variable::setEquivalenceMappingId(c1->variable("v1"), c2->variable("v2"), "map_id");
    libcellml::Variable::setEquivalenceConnectionId(c1->variable("v1"), c2->variable("v2"), "connection_id");

    // Reset children.
    auto reset = libcellml::Reset::create();
    reset->setResetValueId("reset_value_id");
    reset->setTestValueId("test_value_id");
    c1->addReset(reset);

    annotator->setModel(model);

    // Unit items are returned as a CellmlElementType enum and a UnitsItemPtr which holds a parent and an index:
    EXPECT_EQ(libcellml::CellmlElementType::UNIT, annotator->item("unit1_id")->type());
    EXPECT_EQ(units, annotator->item("unit1_id")->unitsItem()->units());
    EXPECT_EQ(size_t(0), annotator->item("unit1_id")->unitsItem()->index());
    EXPECT_EQ(libcellml::CellmlElementType::UNIT, annotator->item("unit2_id")->type());
    EXPECT_EQ(units, annotator->item("unit2_id")->unitsItem()->units());
    EXPECT_EQ(size_t(1), annotator->item("unit2_id")->unitsItem()->index());
    EXPECT_EQ(libcellml::CellmlElementType::UNIT, annotator->item("unit3_id")->type());
    EXPECT_EQ(units, annotator->item("unit3_id")->unitsItem()->units());
    EXPECT_EQ(size_t(2), annotator->item("unit3_id")->unitsItem()->index());

    // Connections and map variables are returned as VariablePairs.  Note that connection identifiers could be
    // represented by any one of the pairs of variables in that connection.
    EXPECT_EQ(libcellml::CellmlElementType::MAP_VARIABLES, annotator->item("map_id")->type());
    auto vpm = annotator->item("map_id")->variablePair();
    EXPECT_EQ(v1, vpm->variable1());
    EXPECT_EQ(v2, vpm->variable2());
    EXPECT_EQ(libcellml::CellmlElementType::CONNECTION, annotator->item("connection_id")->type());
    auto vpc = annotator->item("connection_id")->variablePair();
    EXPECT_TRUE((v1 == vpc->variable1()) || (v3 == vpc->variable1()));
    EXPECT_TRUE((v2 == vpc->variable2()) || (v4 == vpc->variable2()));

    // Component refs are returned as CellmlElementType enum and ComponentPtr:
    EXPECT_EQ(libcellml::CellmlElementType::COMPONENT_REF, annotator->item("component_ref1_id")->type());
    EXPECT_EQ(c1, annotator->item("component_ref1_id")->component());

    // Encapsulation is returned as CellmlElementType enum and ModelPtr:
    EXPECT_EQ(libcellml::CellmlElementType::ENCAPSULATION, annotator->item("encapsulation_id")->type());
    EXPECT_EQ(model, annotator->item("encapsulation_id")->model());

    // Reset children are returned as CellmlElementType enum and reset pointer:
    EXPECT_EQ(libcellml::CellmlElementType::RESET_VALUE, annotator->item("reset_value_id")->type());
    EXPECT_EQ(reset, annotator->item("reset_value_id")->reset());
    EXPECT_EQ(libcellml::CellmlElementType::TEST_VALUE, annotator->item("test_value_id")->type());
    EXPECT_EQ(reset, annotator->item("test_value_id")->reset());
}